

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2text.c
# Opt level: O0

int dh_to_text(BIO *out,void *key,int selection)

{
  uint uVar1;
  BIGNUM *a;
  uint in_EDX;
  DH *in_RSI;
  BIO *in_RDI;
  char *unaff_retaddr;
  BIO *in_stack_00000008;
  BIGNUM *p;
  FFC_PARAMS *params;
  BIGNUM *pub_key;
  BIGNUM *priv_key;
  char *type_label;
  DH *dh;
  char *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  char *file;
  FFC_PARAMS *local_48;
  BIGNUM *local_40;
  BIGNUM *local_38;
  BIO *local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_30 = (BIO *)0x0;
  local_38 = (BIGNUM *)0x0;
  local_40 = (BIGNUM *)0x0;
  local_48 = (FFC_PARAMS *)0x0;
  file = (char *)0x0;
  if ((in_RDI == (BIO *)0x0) || (in_RSI == (DH *)0x0)) {
    ERR_new();
    ERR_set_debug(file,iVar2,in_stack_ffffffffffffffa0);
    ERR_set_error(0x39,0xc0102,(char *)0x0);
    iVar2 = 0;
  }
  else {
    if ((in_EDX & 1) == 0) {
      if ((in_EDX & 2) == 0) {
        if ((in_EDX & 4) != 0) {
          local_30 = (BIO *)0x50284d;
        }
      }
      else {
        local_30 = (BIO *)0x50283f;
      }
    }
    else {
      local_30 = (BIO *)0x502830;
    }
    if (((in_EDX & 1) == 0) || (local_38 = DH_get0_priv_key(in_RSI), local_38 != (BIGNUM *)0x0)) {
      if (((in_EDX & 2) == 0) || (local_40 = DH_get0_pub_key(in_RSI), local_40 != (BIGNUM *)0x0)) {
        if (((in_EDX & 4) == 0) ||
           (local_48 = ossl_dh_get0_params(in_RSI), local_48 != (FFC_PARAMS *)0x0)) {
          a = DH_get0_p(in_RSI);
          if (a == (BIGNUM *)0x0) {
            ERR_new();
            ERR_set_debug((char *)a,iVar2,in_stack_ffffffffffffffa0);
            ERR_set_error(0x39,0x9e,(char *)0x0);
            iVar2 = 0;
          }
          else {
            uVar1 = BN_num_bits((BIGNUM *)a);
            iVar2 = BIO_printf(in_RDI,"%s: (%d bit)\n",local_30,(ulong)uVar1);
            if (iVar2 < 1) {
              iVar2 = 0;
            }
            else if ((local_38 == (BIGNUM *)0x0) ||
                    (iVar2 = print_labeled_bignum
                                       (in_stack_00000008,unaff_retaddr,
                                        (BIGNUM *)
                                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                )), iVar2 != 0)) {
              if ((local_40 == (BIGNUM *)0x0) ||
                 (iVar2 = print_labeled_bignum
                                    (in_stack_00000008,unaff_retaddr,
                                     (BIGNUM *)
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
                 iVar2 != 0)) {
                if ((local_48 == (FFC_PARAMS *)0x0) ||
                   (iVar2 = ffc_params_to_text(local_30,(FFC_PARAMS *)in_RDI), iVar2 != 0)) {
                  iVar2 = 1;
                }
                else {
                  iVar2 = 0;
                }
              }
              else {
                iVar2 = 0;
              }
            }
            else {
              iVar2 = 0;
            }
          }
        }
        else {
          ERR_new();
          ERR_set_debug(file,iVar2,in_stack_ffffffffffffffa0);
          ERR_set_error(0x39,0xe2,(char *)0x0);
          iVar2 = 0;
        }
      }
      else {
        ERR_new();
        ERR_set_debug(file,iVar2,in_stack_ffffffffffffffa0);
        ERR_set_error(0x39,0xdc,(char *)0x0);
        iVar2 = 0;
      }
    }
    else {
      ERR_new();
      ERR_set_debug(file,iVar2,in_stack_ffffffffffffffa0);
      ERR_set_error(0x39,0xdd,(char *)0x0);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int dh_to_text(BIO *out, const void *key, int selection)
{
    const DH *dh = key;
    const char *type_label = NULL;
    const BIGNUM *priv_key = NULL, *pub_key = NULL;
    const FFC_PARAMS *params = NULL;
    const BIGNUM *p = NULL;

    if (out == NULL || dh == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }

    if ((selection & OSSL_KEYMGMT_SELECT_PRIVATE_KEY) != 0)
        type_label = "DH Private-Key";
    else if ((selection & OSSL_KEYMGMT_SELECT_PUBLIC_KEY) != 0)
        type_label = "DH Public-Key";
    else if ((selection & OSSL_KEYMGMT_SELECT_DOMAIN_PARAMETERS) != 0)
        type_label = "DH Parameters";

    if ((selection & OSSL_KEYMGMT_SELECT_PRIVATE_KEY) != 0) {
        priv_key = DH_get0_priv_key(dh);
        if (priv_key == NULL) {
            ERR_raise(ERR_LIB_PROV, PROV_R_NOT_A_PRIVATE_KEY);
            return 0;
        }
    }
    if ((selection & OSSL_KEYMGMT_SELECT_PUBLIC_KEY) != 0) {
        pub_key = DH_get0_pub_key(dh);
        if (pub_key == NULL) {
            ERR_raise(ERR_LIB_PROV, PROV_R_NOT_A_PUBLIC_KEY);
            return 0;
        }
    }
    if ((selection & OSSL_KEYMGMT_SELECT_DOMAIN_PARAMETERS) != 0) {
        params = ossl_dh_get0_params((DH *)dh);
        if (params == NULL) {
            ERR_raise(ERR_LIB_PROV, PROV_R_NOT_PARAMETERS);
            return 0;
        }
    }

    p = DH_get0_p(dh);
    if (p == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_KEY);
        return 0;
    }

    if (BIO_printf(out, "%s: (%d bit)\n", type_label, BN_num_bits(p)) <= 0)
        return 0;
    if (priv_key != NULL
        && !print_labeled_bignum(out, "private-key:", priv_key))
        return 0;
    if (pub_key != NULL
        && !print_labeled_bignum(out, "public-key:", pub_key))
        return 0;
    if (params != NULL
        && !ffc_params_to_text(out, params))
        return 0;

    return 1;
}